

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_rectangle<unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int x1,int y1,int z1,uchar *color,
          float opacity)

{
  CImgArgumentException *this_00;
  char *pcVar1;
  long lVar2;
  
  if ((((this->_data != (uchar *)0x0) && (this->_width != 0)) && (this->_height != 0)) &&
     ((this->_depth != 0 && (this->_spectrum != 0)))) {
    if (color == (uchar *)0x0) {
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
      pcVar1 = "non-";
      if (this->_is_shared != false) {
        pcVar1 = "";
      }
      CImgArgumentException::CImgArgumentException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_rectangle(): Specified color is (null)."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar1,"unsigned char");
      __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
    }
    if (0 < (int)this->_spectrum) {
      lVar2 = 0;
      do {
        draw_rectangle(this,x0,y0,z0,(int)lVar2,x1,y1,z1,(int)lVar2,color[lVar2],opacity);
        lVar2 = lVar2 + 1;
      } while (lVar2 < (int)this->_spectrum);
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_rectangle(const int x0, const int y0, const int z0,
                            const int x1, const int y1, const int z1,
                            const tc *const color, const float opacity=1) {
      if (is_empty()) return *this;
      if (!color)
        throw CImgArgumentException(_cimg_instance
                                    "draw_rectangle(): Specified color is (null).",
                                    cimg_instance);
      cimg_forC(*this,c) draw_rectangle(x0,y0,z0,c,x1,y1,z1,c,(T)color[c],opacity);
      return *this;
    }